

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O0

string * NetwTimeString_abi_cxx11_(float runS)

{
  ulong uVar1;
  string *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  char s [20];
  uint runM;
  uint runH;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  fVar2 = in_XMM0_Da - (float)((long)(in_XMM0_Da / 3600.0) & 0xffffffff) * 3600.0;
  uVar1 = (ulong)(fVar2 / 60.0);
  snprintf(&stack0xffffffffffffffd8,0x14,"%u:%02u:%06.3f",
           (double)(fVar2 - (float)(uVar1 & 0xffffffff) * 60.0),
           (long)(in_XMM0_Da / 3600.0) & 0xffffffff,uVar1 & 0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  return in_RDI;
}

Assistant:

std::string NetwTimeString (float runS)
{
    // Extract hours, minutes, and seconds (incl. fractions) from runS
    const unsigned runH = unsigned(runS / 3600.0f);
    runS -= runH * 3600.0f;
    const unsigned runM = unsigned(runS / 60.0f);
    runS -= runM * 60.0f;

    // Convert to string
    char s[20];
    snprintf(s, sizeof(s), "%u:%02u:%06.3f",
             runH, runM, runS);
    return std::string(s);
}